

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsettingsd.cc
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string config_file;
  SettingsManager manager;
  option options [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string local_160;
  long local_140;
  SettingsManager local_138;
  undefined8 local_b8 [17];
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  puVar7 = &DAT_0010bb80;
  puVar8 = local_b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  _opterr = 0;
  local_140 = 0xffffffff;
  lVar6 = local_140;
  do {
    while (local_140 = lVar6, iVar5 = getopt_long(argc,argv,"c:hs:",local_b8,0),
          sVar3 = local_160._M_string_length, pcVar2 = _optarg, lVar6 = local_140, 0x62 < iVar5) {
      if (iVar5 == 99) {
        strlen(_optarg);
        std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)sVar3,(ulong)pcVar2);
        lVar6 = local_140;
      }
      else if (iVar5 == 0x73) {
        local_138.config_filename_._M_dataplus._M_p = (pointer)0x0;
        lVar6 = strtol(_optarg,(char **)&local_138,10);
        if (((*_optarg == '\0') || (*local_138.config_filename_._M_dataplus._M_p != '\0')) ||
           ((int)lVar6 < 0)) {
          fprintf(_stderr,"Invalid screen \"%s\"\n");
          goto LAB_001038d2;
        }
      }
      else if (iVar5 == 0x68) goto LAB_001038cd;
    }
    if (iVar5 == -1) {
      if ((char *)local_160._M_string_length != (char *)0x0) goto LAB_0010393f;
      xsettingsd::GetDefaultConfigFilePaths_abi_cxx11_();
      if (local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_001038b7;
      lVar6 = 0;
      uVar9 = 0;
      goto LAB_00103889;
    }
  } while (iVar5 != 0x3f);
LAB_001038cd:
  main_cold_1();
  goto LAB_001038d2;
  while( true ) {
    uVar9 = uVar9 + 1;
    lVar6 = lVar6 + 0x20;
    if ((ulong)((long)local_178.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar9) break;
LAB_00103889:
    iVar5 = access(*(char **)((long)&((local_178.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar6),4);
    if (iVar5 == 0) {
      local_138.config_filename_._M_dataplus._M_p = (pointer)&local_138.config_filename_.field_2;
      lVar1 = *(long *)((long)&((local_178.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,lVar1,
                 *(long *)((long)&(local_178.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                          lVar6) + lVar1);
      goto LAB_001038ff;
    }
  }
LAB_001038b7:
  local_138.config_filename_._M_dataplus._M_p = (pointer)&local_138.config_filename_.field_2;
  local_138.config_filename_._M_string_length = 0;
  local_138.config_filename_.field_2._M_local_buf[0] = '\0';
LAB_001038ff:
  std::__cxx11::string::operator=((string *)&local_160,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.config_filename_._M_dataplus._M_p != &local_138.config_filename_.field_2) {
    operator_delete(local_138.config_filename_._M_dataplus._M_p,
                    CONCAT71(local_138.config_filename_.field_2._M_allocated_capacity._1_7_,
                             local_138.config_filename_.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_160._M_string_length != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
LAB_0010393f:
    xsettingsd::SettingsManager::SettingsManager(&local_138,&local_160);
    bVar4 = xsettingsd::SettingsManager::LoadConfig(&local_138);
    iVar5 = 1;
    if ((bVar4) &&
       (bVar4 = xsettingsd::SettingsManager::InitX11(&local_138,(int)local_140,true), bVar4)) {
      signal(1,anon_unknown.dwarf_2f86::HandleSignal);
      iVar5 = 0;
      xsettingsd::SettingsManager::RunEventLoop(&local_138);
    }
    xsettingsd::SettingsManager::~SettingsManager(&local_138);
    goto LAB_001039a0;
  }
  main_cold_2();
LAB_001038d2:
  iVar5 = 1;
LAB_001039a0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,
                    CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                             local_160.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  static const char* kUsage =
      "Usage: xsettingsd [OPTION] ...\n"
      "\n"
      "Daemon implementing the XSETTINGS spec to control settings for X11\n"
      "applications.\n"
      "\n"
      "Options: -c, --config=FILE    config file (default is ~/.xsettingsd)\n"
      "         -h, --help           print this help message\n"
      "         -s, --screen=SCREEN  screen to use (default is all)\n";

  int screen = -1;
  string config_file;

  struct option options[] = {
    { "config", 1, NULL, 'c', },
    { "help", 0, NULL, 'h', },
    { "screen", 1, NULL, 's', },
    { NULL, 0, NULL, 0 },
  };

  opterr = 0;
  while (true) {
    int ch = getopt_long(argc, argv, "c:hs:", options, NULL);
    if (ch == -1) {
      break;
    } else if (ch == 'c') {
      config_file = optarg;
    } else if (ch == 'h' || ch == '?') {
      fprintf(stderr, "%s", kUsage);
      return 1;
    } else if (ch == 's') {
      char* endptr = NULL;
      screen = strtol(optarg, &endptr, 10);
      if (optarg[0] == '\0' || endptr[0] != '\0' || screen < 0) {
        fprintf(stderr, "Invalid screen \"%s\"\n", optarg);
        return 1;
      }
    }
  }

  // Check default config file locations if one wasn't supplied via a flag.
  if (config_file.empty()) {
    const vector<string> paths = xsettingsd::GetDefaultConfigFilePaths();
    config_file = GetFirstReadablePath(paths);
    if (config_file.empty()) {
      fprintf(stderr, "%s: Couldn't find config file. Tried the following:\n",
              xsettingsd::kProgName);
      for (size_t i = 0; i < paths.size(); ++i)
        fprintf(stderr, "  %s\n", paths[i].c_str());
      return 1;
    }
  }

  xsettingsd::SettingsManager manager(config_file);
  if (!manager.LoadConfig())
    return 1;
  if (!manager.InitX11(screen, true))
    return 1;

  signal(SIGHUP, HandleSignal);

  manager.RunEventLoop();
  return 0;
}